

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O1

void __thiscall cubeb_context_variables_Test::TestBody(cubeb_context_variables_Test *this)

{
  bool bVar1;
  stringstream *psVar2;
  int iVar3;
  anon_enum_32 *in_RCX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  int r;
  AssertionResult gtest_ar_;
  uint32_t value;
  cubeb *ctx;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  int local_74;
  AssertionResult local_70;
  uint32_t local_5c;
  cubeb *local_58;
  AssertHelper local_50;
  undefined1 local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_40;
  cubeb_stream_prefs local_38;
  AssertHelper local_30 [2];
  
  local_74 = common_init(&local_58,"test_context_variables");
  local_70._0_8_ = (ulong)(uint)local_70._4_4_ << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (local_48,(char *)&local_74,(int *)&local_70,in_RCX);
  if (local_48[0] == (internal)0x0) {
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (sStack_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((sStack_40.ptr_)->_M_dataplus)._M_p;
    }
    iVar3 = 0x7b;
    local_70._0_8_ = psVar2;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)local_48,"ctx","nullptr",&local_58,(void **)&local_70);
    if (local_48[0] != (internal)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_48._0_4_ = CUBEB_SAMPLE_S16LE;
      local_48._4_4_ = 0xac44;
      sStack_40.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
      local_38 = CUBEB_STREAM_PREF_NONE;
      local_74 = cubeb_get_min_latency(local_58,(cubeb_stream_params *)local_48,&local_5c);
      local_70.success_ = local_74 == -4 || local_74 == 0;
      local_70.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_74 == -4) || (local_74 == 0)) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_70.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_74 == 0) {
          local_70.success_ = local_5c != 0;
          local_70.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_5c == 0) {
            psVar2 = (stringstream *)operator_new(0x188);
            std::__cxx11::stringstream::stringstream(psVar2);
            *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
            local_80.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
            testing::internal::GetBoolAssertionFailureMessage
                      ((internal *)local_30,&local_70,"value > 0","false","true");
            iVar3 = 0x87;
            goto LAB_00108289;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_70.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        local_74 = cubeb_get_preferred_sample_rate(local_58,&local_5c);
        local_70.success_ = local_74 == -4 || local_74 == 0;
        local_70.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((local_74 == -4) || (local_74 == 0)) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_70.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_74 != 0) {
LAB_00107fab:
            cubeb_destroy(local_58);
            return;
          }
          local_70.success_ = local_5c != 0;
          local_70.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_5c != 0) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_70.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_00107fab;
          }
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)local_30,&local_70,"value > 0","false","true");
          iVar3 = 0x8d;
        }
        else {
          psVar2 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar2);
          *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
          local_80.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)local_30,&local_70,
                     "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false","true");
          iVar3 = 0x8b;
        }
      }
      else {
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
        testing::internal::GetBoolAssertionFailureMessage
                  ((internal *)local_30,&local_70,"r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED",
                   "false","true");
        iVar3 = 0x85;
      }
LAB_00108289:
      this_00 = &local_70.message_;
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,iVar3,(char *)local_30[0].data_);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_30[0].data_ != (AssertHelperData *)0x0) {
        operator_delete__(local_30[0].data_);
      }
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      goto LAB_001080c4;
    }
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (sStack_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((sStack_40.ptr_)->_M_dataplus)._M_p;
    }
    iVar3 = 0x7c;
    local_70._0_8_ = psVar2;
  }
  this_00 = &sStack_40;
  testing::internal::AssertHelper::AssertHelper
            (local_30,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,iVar3,message);
  testing::internal::AssertHelper::operator=(local_30,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(local_30);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((stringstream *)local_70._0_8_ != (stringstream *)0x0)) {
      (**(code **)(*(long *)local_70._0_8_ + 8))();
    }
    local_70._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
LAB_001080c4:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cubeb, context_variables)
{
  int r;
  cubeb * ctx;
  uint32_t value;
  cubeb_stream_params params;

  r = common_init(&ctx, "test_context_variables");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.channels = STREAM_CHANNELS;
  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_get_min_latency(ctx, &params, &value);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_TRUE(value > 0);
  }

  r = cubeb_get_preferred_sample_rate(ctx, &value);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_TRUE(value > 0);
  }

  cubeb_destroy(ctx);
}